

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O3

int archive_write_ar_header(archive_write *a,archive_entry *entry)

{
  char *pcVar1;
  long *plVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  mode_t mVar6;
  long v;
  char *pcVar7;
  char *__s;
  char *pcVar8;
  time_t v_00;
  la_int64_t lVar9;
  size_t sVar10;
  int s;
  char buff [60];
  undefined8 local_88;
  undefined8 uStack_80;
  char local_78 [56];
  char *local_40;
  la_int64_t local_38;
  
  plVar2 = (long *)a->format_data;
  *(undefined4 *)(plVar2 + 2) = 0;
  v = archive_entry_size(entry);
  pcVar7 = archive_entry_pathname(entry);
  if ((pcVar7 == (char *)0x0) || (cVar4 = *pcVar7, cVar4 == '\0')) {
LAB_00416be7:
    pcVar7 = "Invalid filename";
LAB_00416bee:
    iVar5 = 0x16;
    goto LAB_00416e57;
  }
  if ((char)plVar2[3] == '\0') {
    __archive_write_output(a,"!<arch>\n",8);
    *(undefined1 *)(plVar2 + 3) = 1;
    cVar4 = *pcVar7;
  }
  builtin_strncpy(local_78,"                                          `\n",0x2c);
  local_88 = 0x2020202020202020;
  uStack_80 = 0x2020202020202020;
  if (cVar4 == '/') {
    if (pcVar7[1] == '\0') {
      local_88 = 0x202020202020202f;
LAB_00416c9e:
      bVar3 = false;
      __s = (char *)0x0;
LAB_00416dbb:
      v_00 = archive_entry_mtime(entry);
      iVar5 = format_decimal(v_00,local_78,0xc);
      if (iVar5 == 0) {
        lVar9 = archive_entry_uid(entry);
        iVar5 = format_decimal(lVar9,local_78 + 0xc,6);
        if (iVar5 == 0) {
          lVar9 = archive_entry_gid(entry);
          iVar5 = format_decimal(lVar9,local_78 + 0x12,6);
          if (iVar5 == 0) {
            mVar6 = archive_entry_mode(entry);
            iVar5 = format_octal((ulong)mVar6,local_78 + 0x18,s);
            if (iVar5 == 0) {
              if (__s == (char *)0x0) goto LAB_00416b9b;
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 != 0x8000) {
                pcVar7 = "Regular file required for non-pseudo member";
                goto LAB_00416bee;
              }
              goto LAB_00416b9e;
            }
            pcVar7 = "Numeric mode too large";
          }
          else {
            pcVar7 = "Numeric group ID too large";
          }
        }
        else {
          pcVar7 = "Numeric user ID too large";
        }
      }
      else {
        pcVar7 = "File modification time too large";
      }
    }
    else {
      iVar5 = strcmp(pcVar7,"__.SYMDEF");
      if (iVar5 == 0) goto LAB_00416bfb;
      if ((pcVar7[1] != '/') || (pcVar7[2] != '\0')) goto LAB_00416bd7;
      *(undefined4 *)(plVar2 + 2) = 1;
      local_88 = CONCAT62(local_88._2_6_,0x2f2f);
      bVar3 = false;
LAB_00416b9b:
      __s = (char *)0x0;
LAB_00416b9e:
      iVar5 = format_decimal(v,local_78 + 0x20,10);
      if (iVar5 == 0) {
        iVar5 = __archive_write_output(a,&local_88,0x3c);
        if (iVar5 != 0) {
          return iVar5;
        }
        *plVar2 = v;
        plVar2[1] = (ulong)((uint)v & 1);
        if (!bVar3) {
          return 0;
        }
        sVar10 = strlen(__s);
        iVar5 = __archive_write_output(a,__s,sVar10);
        if (iVar5 != 0) {
          return iVar5;
        }
        sVar10 = strlen(__s);
        *plVar2 = *plVar2 - sVar10;
        return 0;
      }
      pcVar7 = "File size out of range";
    }
  }
  else {
    iVar5 = strcmp(pcVar7,"__.SYMDEF");
    if (iVar5 == 0) {
LAB_00416bfb:
      local_88 = 0x45444d59532e5f5f;
      uStack_80 = CONCAT71(uStack_80._1_7_,0x46);
      goto LAB_00416c9e;
    }
LAB_00416bd7:
    sVar10 = strlen(pcVar7);
    if (pcVar7[sVar10 - 1] == '/') goto LAB_00416be7;
    pcVar8 = pcVar7 + sVar10;
    do {
      __s = pcVar8 + -1;
      if (__s <= pcVar7) break;
      pcVar1 = pcVar8 + -2;
      pcVar8 = __s;
    } while (*pcVar1 != '/');
    iVar5 = (a->archive).archive_format;
    if (iVar5 == 0x70001) {
      sVar10 = strlen(__s);
      if (0xf < sVar10) {
        if (*(int *)((long)plVar2 + 0x14) < 1) {
          pcVar7 = "Can\'t find string table";
        }
        else {
          local_38 = v;
          pcVar7 = (char *)malloc(sVar10 + 3);
          if (pcVar7 == (char *)0x0) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate filename buffer");
            return -0x1e;
          }
          memcpy(pcVar7,__s,sVar10);
          sVar10 = strlen(__s);
          (pcVar7 + sVar10)[0] = '/';
          (pcVar7 + sVar10)[1] = '\n';
          pcVar7[sVar10 + 2] = '\0';
          local_40 = (char *)plVar2[4];
          pcVar8 = strstr(local_40,pcVar7);
          free(pcVar7);
          if (pcVar8 != (char *)0x0) {
            local_88 = CONCAT71(local_88._1_7_,0x2f);
            iVar5 = format_decimal((long)pcVar8 - (long)local_40,(char *)((long)&local_88 + 1),0xf);
            if (iVar5 == 0) {
              bVar3 = false;
              v = local_38;
              goto LAB_00416dbb;
            }
            pcVar7 = "string table offset too large";
            goto LAB_00416e4f;
          }
          pcVar7 = "Invalid string table";
        }
        goto LAB_00416bee;
      }
      memcpy(&local_88,__s,sVar10);
      *(undefined1 *)((long)&local_88 + sVar10) = 0x2f;
LAB_00416db8:
      bVar3 = false;
      goto LAB_00416dbb;
    }
    if (iVar5 != 0x70002) goto LAB_00416db8;
    sVar10 = strlen(__s);
    if ((sVar10 < 0x11) && (pcVar7 = strchr(__s,0x20), pcVar7 == (char *)0x0)) {
      memcpy(&local_88,__s,sVar10);
      *(undefined1 *)((long)&local_88 + sVar10) = 0x20;
      goto LAB_00416db8;
    }
    local_88 = CONCAT53(local_88._3_5_,0x2f0000);
    local_88 = CONCAT62(local_88._2_6_,0x3123);
    iVar5 = format_decimal(sVar10,(char *)((long)&local_88 + 3),0xd);
    if (iVar5 == 0) {
      sVar10 = strlen(__s);
      bVar3 = true;
      v = v + sVar10;
      goto LAB_00416dbb;
    }
    pcVar7 = "File name too long";
  }
LAB_00416e4f:
  iVar5 = 0x22;
LAB_00416e57:
  archive_set_error(&a->archive,iVar5,pcVar7);
  return -0x14;
}

Assistant:

static int
archive_write_ar_header(struct archive_write *a, struct archive_entry *entry)
{
	int ret, append_fn;
	char buff[60];
	char *ss, *se;
	struct ar_w *ar;
	const char *pathname;
	const char *filename;
	int64_t size;

	append_fn = 0;
	ar = (struct ar_w *)a->format_data;
	ar->is_strtab = 0;
	filename = NULL;
	size = archive_entry_size(entry);


	/*
	 * Reject files with empty name.
	 */
	pathname = archive_entry_pathname(entry);
	if (pathname == NULL || *pathname == '\0') {
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	/*
	 * If we are now at the beginning of the archive,
	 * we need first write the ar global header.
	 */
	if (!ar->wrote_global_header) {
		__archive_write_output(a, "!<arch>\n", 8);
		ar->wrote_global_header = 1;
	}

	memset(buff, ' ', 60);
	memcpy(&buff[AR_fmag_offset], "`\n", 2);

	if (strcmp(pathname, "/") == 0 ) {
		/* Entry is archive symbol table in GNU format */
		buff[AR_name_offset] = '/';
		goto stat;
	}
	if (strcmp(pathname, "__.SYMDEF") == 0) {
		/* Entry is archive symbol table in BSD format */
		memcpy(buff + AR_name_offset, "__.SYMDEF", 9);
		goto stat;
	}
	if (strcmp(pathname, "//") == 0) {
		/*
		 * Entry is archive filename table, inform that we should
		 * collect strtab in next _data call.
		 */
		ar->is_strtab = 1;
		buff[AR_name_offset] = buff[AR_name_offset + 1] = '/';
		/*
		 * For archive string table, only ar_size field should
		 * be set.
		 */
		goto size;
	}

	/*
	 * Otherwise, entry is a normal archive member.
	 * Strip leading paths from filenames, if any.
	 */
	if ((filename = ar_basename(pathname)) == NULL) {
		/* Reject filenames with trailing "/" */
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	if (a->archive.archive_format == ARCHIVE_FORMAT_AR_GNU) {
		/*
		 * SVR4/GNU variant use a "/" to mark then end of the filename,
		 * make it possible to have embedded spaces in the filename.
		 * So, the longest filename here (without extension) is
		 * actually 15 bytes.
		 */
		if (strlen(filename) <= 15) {
			memcpy(&buff[AR_name_offset],
			    filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = '/';
		} else {
			/*
			 * For filename longer than 15 bytes, GNU variant
			 * makes use of a string table and instead stores the
			 * offset of the real filename to in the ar_name field.
			 * The string table should have been written before.
			 */
			if (ar->has_strtab <= 0) {
				archive_set_error(&a->archive, EINVAL,
				    "Can't find string table");
				return (ARCHIVE_WARN);
			}

			se = (char *)malloc(strlen(filename) + 3);
			if (se == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate filename buffer");
				return (ARCHIVE_FATAL);
			}

			memcpy(se, filename, strlen(filename));
			strcpy(se + strlen(filename), "/\n");

			ss = strstr(ar->strtab, se);
			free(se);

			if (ss == NULL) {
				archive_set_error(&a->archive, EINVAL,
				    "Invalid string table");
				return (ARCHIVE_WARN);
			}

			/*
			 * GNU variant puts "/" followed by digits into
			 * ar_name field. These digits indicates the real
			 * filename string's offset to the string table.
			 */
			buff[AR_name_offset] = '/';
			if (format_decimal(ss - ar->strtab,
			    buff + AR_name_offset + 1,
			    AR_name_size - 1)) {
				archive_set_error(&a->archive, ERANGE,
				    "string table offset too large");
				return (ARCHIVE_WARN);
			}
		}
	} else if (a->archive.archive_format == ARCHIVE_FORMAT_AR_BSD) {
		/*
		 * BSD variant: for any file name which is more than
		 * 16 chars or contains one or more embedded space(s), the
		 * string "#1/" followed by the ASCII length of the name is
		 * put into the ar_name field. The file size (stored in the
		 * ar_size field) is incremented by the length of the name.
		 * The name is then written immediately following the
		 * archive header.
		 */
		if (strlen(filename) <= 16 && strchr(filename, ' ') == NULL) {
			memcpy(&buff[AR_name_offset], filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = ' ';
		}
		else {
			memcpy(buff + AR_name_offset, "#1/", 3);
			if (format_decimal(strlen(filename),
			    buff + AR_name_offset + 3,
			    AR_name_size - 3)) {
				archive_set_error(&a->archive, ERANGE,
				    "File name too long");
				return (ARCHIVE_WARN);
			}
			append_fn = 1;
			size += strlen(filename);
		}
	}

stat:
	if (format_decimal(archive_entry_mtime(entry), buff + AR_date_offset, AR_date_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File modification time too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_uid(entry), buff + AR_uid_offset, AR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_gid(entry), buff + AR_gid_offset, AR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_octal(archive_entry_mode(entry), buff + AR_mode_offset, AR_mode_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric mode too large");
		return (ARCHIVE_WARN);
	}
	/*
	 * Sanity Check: A non-pseudo archive member should always be
	 * a regular file.
	 */
	if (filename != NULL && archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, EINVAL,
		    "Regular file required for non-pseudo member");
		return (ARCHIVE_WARN);
	}

size:
	if (format_decimal(size, buff + AR_size_offset, AR_size_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, buff, 60);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining = size;
	ar->entry_padding = ar->entry_bytes_remaining % 2;

	if (append_fn > 0) {
		ret = __archive_write_output(a, filename, strlen(filename));
		if (ret != ARCHIVE_OK)
			return (ret);
		ar->entry_bytes_remaining -= strlen(filename);
	}

	return (ARCHIVE_OK);
}